

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O2

void __thiscall GibbsSamplerFromHDP::calculateLogLikelihood(GibbsSamplerFromHDP *this)

{
  ostream *poVar1;
  int k;
  uint uVar2;
  int i;
  ulong uVar3;
  int j;
  ulong uVar4;
  double dVar5;
  double local_88;
  double logLikelihood;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  probabilityMatrix;
  
  (*this->_vptr_GibbsSamplerFromHDP[8])(this,1);
  logLikelihood = 0.0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_60,&this->_thetaEx);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_78,&this->_phiEx);
  dot<double>(&probabilityMatrix,&local_60,&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_60);
  local_88 = 0.0;
  for (uVar4 = 0; uVar4 < this->_J; uVar4 = uVar4 + 1) {
    for (uVar3 = 0;
        uVar3 < (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]; uVar3 = uVar3 + 1) {
      for (uVar2 = 0; uVar2 < this->_K; uVar2 = uVar2 + 1) {
        dVar5 = log(probabilityMatrix.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar4].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [*(uint *)(*(long *)&(this->_xji).
                                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data + uVar3 * 4)]);
        local_88 = local_88 + dVar5;
        logLikelihood = local_88;
      }
    }
  }
  poVar1 = std::ostream::_M_insert<double>(local_88);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<double,_std::allocator<double>_>::push_back(&this->_logLikelihood,&logLikelihood);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&probabilityMatrix);
  return;
}

Assistant:

void GibbsSamplerFromHDP::calculateLogLikelihood(){//{{{
    this->calculateExpectations(true);
    double logLikelihood = 0;
    vector<vector<double> > probabilityMatrix = dot(_thetaEx, _phiEx);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            for(int k=0; k<_K; k++){
                logLikelihood += log(probabilityMatrix[j][_xji[j][i]]);
            }
        }
    }
    cout<<logLikelihood<<endl;
    _logLikelihood.push_back(logLikelihood);
}